

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_whole_block(void *vctx,uint8_t *buf)

{
  int local_6c;
  uint32_t local_68;
  int i;
  uint32_t c [17];
  cf_poly1305 *ctx;
  uint8_t *buf_local;
  void *vctx_local;
  
  for (local_6c = 0; local_6c < 0x10; local_6c = local_6c + 1) {
    (&local_68)[local_6c] = (uint)buf[local_6c];
  }
  c[0xe] = 1;
  unique0x10000056 = vctx;
  poly1305_block((cf_poly1305 *)vctx,&local_68);
  return;
}

Assistant:

static void poly1305_whole_block(void *vctx,
                                 const uint8_t *buf)
{
  cf_poly1305 *ctx = vctx;
  uint32_t c[17];
  int i;

  for (i = 0; i < 16; i++)
    c[i] = buf[i];

  c[16] = 1;
  poly1305_block(ctx, c);
}